

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

PmError alsa_use_queue(void)

{
  undefined8 uVar1;
  int iVar2;
  PmError PVar3;
  long lVar4;
  size_t __n;
  undefined1 *__s;
  undefined8 uStack_20;
  undefined1 auStack_18 [8];
  
  if (queue_used == 0) {
    uStack_20 = 0x104c9e;
    queue = snd_seq_alloc_queue(seq);
    iVar2 = queue;
    if (-1 < queue) {
      uStack_20 = 0x104cb1;
      lVar4 = snd_seq_queue_tempo_sizeof();
      lVar4 = -(lVar4 + 0xfU & 0xfffffffffffffff0);
      __s = auStack_18 + lVar4;
      *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104cc7;
      __n = snd_seq_queue_tempo_sizeof();
      *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104cd4;
      memset(__s,0,__n);
      *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104ce1;
      snd_seq_queue_tempo_set_tempo(__s,480000);
      *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104cee;
      snd_seq_queue_tempo_set_ppq(__s,0x1e0);
      *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104d03;
      pm_hosterror = snd_seq_set_queue_tempo(seq,queue,__s);
      iVar2 = pm_hosterror;
      if (-1 < pm_hosterror) {
        *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x1e;
        uVar1 = *(undefined8 *)(auStack_18 + lVar4 + -8);
        *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104d2a;
        snd_seq_control_queue(seq,queue,uVar1,0,0);
        *(undefined8 *)(auStack_18 + lVar4 + -8) = 0x104d36;
        snd_seq_drain_output(seq);
        goto LAB_00104c83;
      }
    }
    pm_hosterror = iVar2;
    PVar3 = pmHostError;
  }
  else {
LAB_00104c83:
    queue_used = queue_used + 1;
    PVar3 = pmNoData;
  }
  return PVar3;
}

Assistant:

static PmError alsa_use_queue(void)
{
    if (queue_used == 0) {
        snd_seq_queue_tempo_t *tempo;

        queue = snd_seq_alloc_queue(seq);
        if (queue < 0) {
            pm_hosterror = queue;
            return pmHostError;
        }
        snd_seq_queue_tempo_alloca(&tempo);
        snd_seq_queue_tempo_set_tempo(tempo, 480000);
        snd_seq_queue_tempo_set_ppq(tempo, 480);
        pm_hosterror = snd_seq_set_queue_tempo(seq, queue, tempo);
        if (pm_hosterror < 0)
            return pmHostError;

        snd_seq_start_queue(seq, queue, NULL);
        snd_seq_drain_output(seq);
    }
    ++queue_used;
    return pmNoError;
}